

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_write_indicator
              (yaml_emitter_t *emitter,char *indicator,int need_whitespace,int is_whitespace,
              int is_indention)

{
  yaml_char_t *pyVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  
  sVar5 = strlen(indicator);
  if ((need_whitespace != 0) && (emitter->whitespace == 0)) {
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
      return 0;
    }
    pyVar1 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar1 + 1;
    *pyVar1 = ' ';
    emitter->column = emitter->column + 1;
  }
  if (sVar5 != 0) {
    pbVar6 = (byte *)(indicator + sVar5);
    do {
      if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
         (iVar4 = yaml_emitter_flush(emitter), iVar4 == 0)) {
        return 0;
      }
      bVar3 = *indicator;
      if ((char)bVar3 < '\0') {
        if ((bVar3 & 0xe0) == 0xc0) {
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = ((byte *)indicator)[1];
          indicator = (char *)((byte *)indicator + 2);
          goto LAB_00107301;
        }
        if ((bVar3 & 0xf0) == 0xe0) {
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = ((byte *)indicator)[1];
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = ((byte *)indicator)[2];
          indicator = (char *)((byte *)indicator + 3);
          goto LAB_00107301;
        }
        if ((bVar3 & 0xf8) == 0xf0) {
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = ((byte *)indicator)[1];
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = ((byte *)indicator)[2];
          pbVar2 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pbVar2 + 1;
          *pbVar2 = bVar3;
          bVar3 = ((byte *)indicator)[3];
          indicator = (char *)((byte *)indicator + 4);
          goto LAB_00107301;
        }
      }
      else {
        indicator = (char *)((byte *)indicator + 1);
LAB_00107301:
        pbVar2 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pbVar2 + 1;
        *pbVar2 = bVar3;
      }
      emitter->column = emitter->column + 1;
    } while ((byte *)indicator != pbVar6);
  }
  emitter->whitespace = is_whitespace;
  emitter->indention = (uint)(is_indention != 0 && emitter->indention != 0);
  emitter->open_ended = 0;
  return 1;
}

Assistant:

static int
yaml_emitter_write_indicator(yaml_emitter_t *emitter,
        const char *indicator, int need_whitespace,
        int is_whitespace, int is_indention)
{
    size_t indicator_length;
    yaml_string_t string;

    indicator_length = strlen(indicator);
    STRING_ASSIGN(string, (yaml_char_t *)indicator, indicator_length);

    if (need_whitespace && !emitter->whitespace) {
        if (!PUT(emitter, ' ')) return 0;
    }

    while (string.pointer != string.end) {
        if (!WRITE(emitter, string)) return 0;
    }

    emitter->whitespace = is_whitespace;
    emitter->indention = (emitter->indention && is_indention);
    emitter->open_ended = 0;

    return 1;
}